

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_IsCoinBase_Test::TestBody(AbstractTransaction_IsCoinBase_Test *this)

{
  bool bVar1;
  void *wally_tx_pointer;
  char *in_R9;
  AssertionResult gtest_ar_;
  TestTransaction tx;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  AssertHelper local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AbstractTransaction local_38;
  string local_28;
  
  TestTransaction::TestTransaction((TestTransaction *)&local_38);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = cfd::core::AbstractTransaction::IsCoinBase(&local_38);
      local_48.data_._0_1_ = (internal)!bVar1;
      local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_48.data_._0_1_) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_28,(internal *)&local_48,(AssertionResult *)"is_coinbase","true","false",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
                   ,0x14c,local_28._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_28._M_dataplus._M_p != &local_28.field_2) {
          operator_delete(local_28._M_dataplus._M_p);
        }
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
        }
      }
      goto LAB_00250e26;
    }
  }
  else {
    testing::Message::Message((Message *)&local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x14b,
               "Expected: (is_coinbase = tx.IsCoinBase()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_28._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_28._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_28._M_dataplus._M_p + 8))();
      }
    }
  }
  local_48.data_._0_1_ = (internal)0x1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_00250e26:
  wally_tx_pointer = (void *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38._vptr_AbstractTransaction = (_func_int **)&PTR__AbstractTransaction_006915b0;
  cfd::core::AbstractTransaction::FreeWallyAddress
            ((AbstractTransaction *)local_38.wally_tx_pointer_,wally_tx_pointer);
  return;
}

Assistant:

TEST(AbstractTransaction, IsCoinBase) {
  TestTransaction tx;
  bool is_coinbase = false;
  EXPECT_NO_THROW((is_coinbase = tx.IsCoinBase()));
  EXPECT_FALSE(is_coinbase);
}